

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_gen_edge_cases(void)

{
  int iVar1;
  secp256k1_scalar gn;
  secp256k1_gej res3;
  secp256k1_gej res2;
  secp256k1_gej res1;
  int i;
  secp256k1_scalar *in_stack_000006f8;
  secp256k1_scalar *in_stack_00000700;
  secp256k1_gej *in_stack_00000708;
  secp256k1_gej *in_stack_00000710;
  secp256k1_scalar *in_stack_00000c90;
  secp256k1_ge *in_stack_00000c98;
  secp256k1_gej *in_stack_00000ca0;
  secp256k1_scalar *a;
  secp256k1_scalar *r;
  secp256k1_scalar *in_stack_fffffffffffffe30;
  secp256k1_scalar *in_stack_fffffffffffffe38;
  secp256k1_scalar *in_stack_fffffffffffffe40;
  secp256k1_gej *in_stack_fffffffffffffe98;
  secp256k1_gej *in_stack_fffffffffffffea0;
  secp256k1_scalar *in_stack_ffffffffffffff60;
  secp256k1_gej *in_stack_ffffffffffffff68;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffff70;
  int local_4;
  
  a = (secp256k1_scalar *)0x0;
  r = (secp256k1_scalar *)0x0;
  secp256k1_scalar_add
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  secp256k1_scalar_negate(r,a);
  local_4 = -1;
  while( true ) {
    if (1 < local_4) {
      return;
    }
    secp256k1_ecmult_gen
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    secp256k1_ecmult(in_stack_00000710,in_stack_00000708,in_stack_00000700,in_stack_000006f8);
    secp256k1_ecmult_const(in_stack_00000ca0,in_stack_00000c98,in_stack_00000c90);
    iVar1 = secp256k1_gej_eq_var(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    if (iVar1 == 0) break;
    iVar1 = secp256k1_gej_eq_var(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x15e1,"test condition failed: secp256k1_gej_eq_var(&res1, &res3)");
      abort();
    }
    secp256k1_scalar_add
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    local_4 = local_4 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x15e0,"test condition failed: secp256k1_gej_eq_var(&res1, &res2)");
  abort();
}

Assistant:

static void test_ecmult_gen_edge_cases(void) {
    int i;
    secp256k1_gej res1, res2, res3;
    secp256k1_scalar gn = secp256k1_scalar_one; /* gn = 1 */
    secp256k1_scalar_add(&gn, &gn, &CTX->ecmult_gen_ctx.scalar_offset); /* gn = 1 + scalar_offset */
    secp256k1_scalar_negate(&gn, &gn); /* gn = -1 - scalar_offset */

    for (i = -1; i < 2; ++i) {
        /* Run test with gn = i - scalar_offset (so that the ecmult_gen recoded value represents i). */
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &res1, &gn);
        secp256k1_ecmult(&res2, NULL, &secp256k1_scalar_zero, &gn);
        secp256k1_ecmult_const(&res3, &secp256k1_ge_const_g, &gn);
        CHECK(secp256k1_gej_eq_var(&res1, &res2));
        CHECK(secp256k1_gej_eq_var(&res1, &res3));
        secp256k1_scalar_add(&gn, &gn, &secp256k1_scalar_one);
    }
}